

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::UnitTest::test_suite_to_run_count(UnitTest *this)

{
  int iVar1;
  pointer ppTVar2;
  
  iVar1 = 0;
  for (ppTVar2 = (this->impl_->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (this->impl_->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    iVar1 = iVar1 + (uint)(*ppTVar2)->should_run_;
  }
  return iVar1;
}

Assistant:

int UnitTest::test_suite_to_run_count() const {
  return impl()->test_suite_to_run_count();
}